

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__write(uv_stream_t *stream)

{
  undefined1 *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  
  if ((stream->io_watcher).fd < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                  ,0x37a,"void uv__write(uv_stream_t *)");
  }
  do {
    puVar1 = (undefined1 *)stream->write_queue[0];
    if (stream->write_queue == (void **)puVar1) {
      return;
    }
    if (*(uv_stream_t **)(puVar1 + -8) != stream) {
      __assert_fail("req->handle == stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                    ,0x382,"void uv__write(uv_stream_t *)");
    }
    uVar3 = uv__try_write(stream,(uv_buf_t *)
                                 ((ulong)*(uint *)(puVar1 + 0x10) * 0x10 + *(long *)(puVar1 + 0x18))
                          ,*(int *)(puVar1 + 0x20) - *(uint *)(puVar1 + 0x10),
                          *(uv_stream_t **)(puVar1 + -0x10));
    if ((int)uVar3 < 0) {
      if (uVar3 != 0xfffffff5) {
        *(uint *)(puVar1 + 0x24) = uVar3;
        uv__write_req_finish((uv_write_t *)(puVar1 + -0x58));
        uv__io_stop(stream->loop,&stream->io_watcher,4);
        return;
      }
    }
    else {
      *(undefined8 *)(puVar1 + -0x10) = 0;
      uVar4 = (ulong)uVar3;
      if (stream->write_queue_size < uVar4) {
        __assert_fail("n <= stream->write_queue_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                      ,0x2e7,"int uv__write_req_update(uv_stream_t *, uv_write_t *, size_t)");
      }
      stream->write_queue_size = stream->write_queue_size - uVar4;
      plVar6 = (long *)((ulong)*(uint *)(puVar1 + 0x10) * 0x10 + *(long *)(puVar1 + 0x18));
      do {
        uVar2 = plVar6[1];
        uVar7 = uVar2;
        if (uVar4 < uVar2) {
          uVar7 = uVar4;
        }
        *plVar6 = *plVar6 + uVar7;
        plVar6[1] = uVar2 - uVar7;
        plVar6 = plVar6 + (ulong)(uVar2 <= uVar4) * 2;
        uVar4 = uVar4 - uVar7;
      } while (uVar4 != 0);
      iVar5 = (int)((ulong)((long)plVar6 - *(long *)(puVar1 + 0x18)) >> 4);
      *(int *)(puVar1 + 0x10) = iVar5;
      if (*(int *)(puVar1 + 0x20) == iVar5) {
        uv__write_req_finish((uv_write_t *)(puVar1 + -0x58));
        return;
      }
    }
    if ((stream->flags & 0x100000) == 0) {
      uv__io_start(stream->loop,&stream->io_watcher,4);
      return;
    }
  } while( true );
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  QUEUE* q;
  uv_write_t* req;
  ssize_t n;

  assert(uv__stream_fd(stream) >= 0);

  for (;;) {
    if (QUEUE_EMPTY(&stream->write_queue))
      return;

    q = QUEUE_HEAD(&stream->write_queue);
    req = QUEUE_DATA(q, uv_write_t, queue);
    assert(req->handle == stream);

    n = uv__try_write(stream,
                      &(req->bufs[req->write_index]),
                      req->nbufs - req->write_index,
                      req->send_handle);

    /* Ensure the handle isn't sent again in case this is a partial write. */
    if (n >= 0) {
      req->send_handle = NULL;
      if (uv__write_req_update(stream, req, n)) {
        uv__write_req_finish(req);
        return;  /* TODO(bnoordhuis) Start trying to write the next request. */
      }
    } else if (n != UV_EAGAIN)
      break;

    /* If this is a blocking stream, try again. */
    if (stream->flags & UV_HANDLE_BLOCKING_WRITES)
      continue;

    /* We're not done. */
    uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

    /* Notify select() thread about state change */
    uv__stream_osx_interrupt_select(stream);

    return;
  }

  req->error = n;
  // XXX(jwn): this must call uv__stream_flush_write_queue(stream, n) here, since we won't generate any more events
  uv__write_req_finish(req);
  uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  uv__stream_osx_interrupt_select(stream);
}